

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

void Hop_ManCreateRefs(Hop_Man_t *p)

{
  undefined1 *puVar1;
  int *piVar2;
  Hop_Obj_t *pHVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  
  if (p->fRefCount != 0) {
    return;
  }
  p->fRefCount = 1;
  puVar1 = &p->pConst1->field_0x20;
  *(uint *)puVar1 = *(uint *)puVar1 & 0x3f;
  for (iVar6 = 0; iVar6 < p->vPis->nSize; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(p->vPis,iVar6);
    *(uint *)((long)pvVar4 + 0x20) = *(uint *)((long)pvVar4 + 0x20) & 0x3f;
  }
  for (lVar5 = 0; lVar5 < p->nTableSize; lVar5 = lVar5 + 1) {
    if (p->pTable[lVar5] != (Hop_Obj_t *)0x0) {
      puVar1 = &p->pTable[lVar5]->field_0x20;
      *(uint *)puVar1 = *(uint *)puVar1 & 0x3f;
    }
  }
  for (iVar6 = 0; iVar6 < p->vPos->nSize; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(p->vPos,iVar6);
    *(uint *)((long)pvVar4 + 0x20) = *(uint *)((long)pvVar4 + 0x20) & 0x3f;
  }
  for (lVar5 = 0; lVar5 < p->nTableSize; lVar5 = lVar5 + 1) {
    pHVar3 = p->pTable[lVar5];
    if (pHVar3 != (Hop_Obj_t *)0x0) {
      piVar2 = (int *)(((ulong)pHVar3->pFanin0 & 0xfffffffffffffffe) + 0x20);
      *piVar2 = *piVar2 + 0x40;
      piVar2 = (int *)(((ulong)pHVar3->pFanin1 & 0xfffffffffffffffe) + 0x20);
      *piVar2 = *piVar2 + 0x40;
    }
  }
  for (iVar6 = 0; iVar6 < p->vPos->nSize; iVar6 = iVar6 + 1) {
    pvVar4 = Vec_PtrEntry(p->vPos,iVar6);
    piVar2 = (int *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x20);
    *piVar2 = *piVar2 + 0x40;
  }
  return;
}

Assistant:

void Hop_ManCreateRefs( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    if ( p->fRefCount )
        return;
    p->fRefCount = 1;
    // clear refs
    Hop_ObjClearRef( Hop_ManConst1(p) );
    Hop_ManForEachPi( p, pObj, i )
        Hop_ObjClearRef( pObj );
    Hop_ManForEachNode( p, pObj, i )
        Hop_ObjClearRef( pObj );
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjClearRef( pObj );
    // set refs
    Hop_ManForEachNode( p, pObj, i )
    {
        Hop_ObjRef( Hop_ObjFanin0(pObj) );
        Hop_ObjRef( Hop_ObjFanin1(pObj) );
    }
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjRef( Hop_ObjFanin0(pObj) );
}